

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O1

int __thiscall imrt::Station::get_sum_alpha(Station *this,string *strategy)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = std::__cxx11::string::compare((char *)strategy);
  if (iVar2 == 0) {
    iVar2 = 0;
    for (pdVar4 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 != (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
      iVar2 = (int)((double)iVar2 + *pdVar4);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)strategy);
    iVar2 = 0;
    if (iVar3 == 0) {
      iVar3 = Collimator::getXdim(this->collimator);
      iVar2 = 0;
      if (0 < iVar3) {
        lVar5 = 0;
        iVar2 = 0;
        do {
          iVar3 = Collimator::getYdim(this->collimator);
          if (0 < iVar3) {
            lVar6 = 0;
            do {
              dVar1 = (this->I).p[lVar5][lVar6];
              if ((double)iVar2 < dVar1) {
                iVar2 = (int)dVar1;
              }
              lVar6 = lVar6 + 1;
              iVar3 = Collimator::getYdim(this->collimator);
            } while (lVar6 < iVar3);
          }
          lVar5 = lVar5 + 1;
          iVar3 = Collimator::getXdim(this->collimator);
        } while (lVar5 < iVar3);
      }
    }
  }
  return iVar2;
}

Assistant:

int get_sum_alpha(string strategy) const{
    int intens=0;
    if(strategy=="dao_ls"){
      for(auto i:intensity) intens+=i;
      return (intens);
    }else if(strategy=="ibo_ls"){
	    for (int i=0; i<collimator.getXdim();i++)
		    for (int j=0; j<collimator.getYdim(); j++)
          if(I(i,j)>intens) intens=I(i,j);
      return (intens);
    }
    return(intens);
  }